

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O3

sexp_conflict
json_write_string(sexp_conflict ctx,sexp_conflict self,sexp_conflict obj,sexp_conflict out)

{
  sexp psVar1;
  sexp psVar2;
  int iVar3;
  uint __c;
  sexp psVar4;
  sexp_conflict psVar5;
  ulong uVar6;
  char *__s;
  ulong uVar7;
  char cout [32];
  char local_58 [40];
  
  psVar1 = (obj->value).type.slots;
  psVar4 = (out->value).type.setters;
  if (psVar4 == (sexp)0x0) {
    putc(0x22,(FILE *)(out->value).type.getters);
  }
  else {
    psVar2 = (out->value).type.print;
    if (psVar2 < (sexp)(out->value).port.size) {
      (out->value).type.print = (sexp)((long)&psVar2->tag + 1);
      *(undefined1 *)((long)&psVar2->tag + (long)&psVar4->tag) = 0x22;
    }
    else {
      sexp_buffered_write_char(ctx,0x22,out);
    }
  }
  if (psVar1 != (sexp)0x0) {
    uVar7 = 2;
    do {
      __s = local_58;
      sexp_string_utf8_ref(ctx,obj,uVar7);
      uVar6 = (ulong)(int)__c;
      if (0x7e < uVar6) {
        if (uVar6 < 0x10000) {
          snprintf(__s,0x20,"\\u%04lX");
        }
        else {
          if (0xa0ffff < uVar6) {
            psVar5 = sexp_json_write_exception(ctx,self,"unable to encode string",obj);
            return psVar5;
          }
          snprintf(__s,0x20,"\\u%04lX\\u%04lX",(uVar6 >> 10) + 0xd7c0,(ulong)(__c & 0x3ff) | 0xdc00)
          ;
        }
        if ((out->value).type.setters == (sexp)0x0) {
          psVar4 = (out->value).type.getters;
          goto LAB_001038f3;
        }
        goto LAB_001038e2;
      }
      psVar4 = (out->value).type.setters;
      switch(uVar6) {
      case 8:
        if (psVar4 != (sexp)0x0) {
          __s = "\\b";
          break;
        }
        psVar4 = (out->value).type.getters;
        __s = "\\b";
LAB_001038f3:
        fputs(__s,(FILE *)psVar4);
        goto LAB_001038f8;
      case 9:
        if (psVar4 == (sexp)0x0) {
          psVar4 = (out->value).type.getters;
          __s = "\\t";
          goto LAB_001038f3;
        }
        __s = "\\t";
        break;
      case 10:
        if (psVar4 == (sexp)0x0) {
          psVar4 = (out->value).type.getters;
          __s = "\\n";
          goto LAB_001038f3;
        }
        __s = "\\n";
        break;
      case 0xb:
switchD_00103861_caseD_b:
        if (psVar4 == (sexp)0x0) {
          putc(__c,(FILE *)(out->value).type.getters);
        }
        else {
          psVar2 = (out->value).type.print;
          if (psVar2 < (sexp)(out->value).port.size) {
            (out->value).type.print = (sexp)((long)&psVar2->tag + 1);
            *(char *)((long)&psVar2->tag + (long)&psVar4->tag) = (char)__c;
          }
          else {
            sexp_buffered_write_char(ctx,__c,out);
          }
        }
        goto LAB_001038f8;
      case 0xc:
        if (psVar4 == (sexp)0x0) {
          psVar4 = (out->value).type.getters;
          __s = "\\f";
          goto LAB_001038f3;
        }
        __s = "\\f";
        break;
      case 0xd:
        if (psVar4 == (sexp)0x0) {
          psVar4 = (out->value).type.getters;
          __s = "\\r";
          goto LAB_001038f3;
        }
        __s = "\\r";
        break;
      default:
        if (uVar6 != 0x5c) goto switchD_00103861_caseD_b;
        if (psVar4 == (sexp)0x0) {
          psVar4 = (out->value).type.getters;
          __s = "\\\\";
          goto LAB_001038f3;
        }
        __s = "\\\\";
      }
LAB_001038e2:
      sexp_buffered_write_string(ctx,__s,out);
LAB_001038f8:
      uVar7 = uVar7 & 0xfffffffffffffffd;
      uVar6 = uVar7 + 7;
      if (-1 < (long)uVar7) {
        uVar6 = uVar7;
      }
      iVar3 = sexp_utf8_initial_byte_count
                        ((((obj->value).type.cpl)->value).flonum_bits
                         [(long)&((obj->value).type.name)->value + ((long)uVar6 >> 3)]);
      psVar4 = (sexp)((long)iVar3 + ((long)uVar6 >> 3));
      uVar7 = (long)psVar4 * 8 + 2;
    } while (psVar4 < psVar1);
  }
  psVar1 = (out->value).type.setters;
  if (psVar1 == (sexp)0x0) {
    putc(0x22,(FILE *)(out->value).type.getters);
  }
  else {
    psVar4 = (out->value).type.print;
    if (psVar4 < (sexp)(out->value).port.size) {
      (out->value).type.print = (sexp)((long)&psVar4->tag + 1);
      *(undefined1 *)((long)&psVar4->tag + (long)&psVar1->tag) = 0x22;
    }
    else {
      sexp_buffered_write_char(ctx,0x22,out);
    }
  }
  return (sexp_conflict)&DAT_0000043e;
}

Assistant:

sexp json_write_string(sexp ctx, sexp self, const sexp obj, sexp out) {
  char cout[32];  /* oversized to avoid snprintf warnings */
  unsigned long ch, chh, chl;
  sexp i, end = sexp_make_string_cursor(sexp_string_size(obj));

  sexp_write_char(ctx, '"', out);
  for (i = sexp_make_string_cursor(0); i < end;
       i = sexp_string_cursor_next(obj, i)) {
    ch = sexp_unbox_character(sexp_string_cursor_ref(ctx, obj, i));
    if (ch < 0x7F) {
      switch (ch) {
        case '\\':
          sexp_write_string(ctx, "\\\\", out);
          break;
        case '\b':
          sexp_write_string(ctx, "\\b", out);
          break;
        case '\f':
          sexp_write_string(ctx, "\\f", out);
          break;
        case '\n':
          sexp_write_string(ctx, "\\n", out);
          break;
        case '\r':
          sexp_write_string(ctx, "\\r", out);
          break;
        case '\t':
          sexp_write_string(ctx, "\\t", out);
          break;
        default:
          sexp_write_char(ctx, ch, out);
          break;
      }
    } else if (ch <= 0xFFFF) {
      snprintf(cout, sizeof(cout), "\\u%04lX", ch);
      sexp_write_string(ctx, cout, out);
    } else {
      // Surrogate pair
      chh = (0xD800 - (0x10000 >> 10) + ((ch) >> 10));
      chl = (0xDC00 + ((ch) & 0x3FF));
      if (chh > 0xFFFF || chl > 0xFFFF) {
        return sexp_json_write_exception(ctx, self, "unable to encode string", obj);
      }
      snprintf(cout, sizeof(cout), "\\u%04lX\\u%04lX", chh, chl);
      sexp_write_string(ctx, cout, out);
    }
  }
  sexp_write_char(ctx, '"', out);

  return SEXP_VOID;
}